

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lm_trie.c
# Opt level: O2

void base_init(base_t *base,void *base_mem,uint32 max_vocab,uint8 remaining_bits)

{
  byte bVar1;
  
  bVar1 = bitarr_required_bits(max_vocab);
  base->word_bits = bVar1;
  base->word_mask = ~(-1 << (bVar1 & 0x1f));
  if (0x19 < bVar1) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/lm_trie.c"
            ,0x5c,
            "Sorry, word indices more than %d are not implemented.  Edit util/bit_packing.hh and fix the bit packing functions\n"
            ,0x2000000);
    bVar1 = base->word_bits;
  }
  base->total_bits = bVar1 + remaining_bits;
  base->base = (uint8 *)base_mem;
  base->insert_index = 0;
  base->max_vocab = max_vocab;
  return;
}

Assistant:

static void
base_init(base_t * base, void *base_mem, uint32 max_vocab,
          uint8 remaining_bits)
{
    base->word_bits = bitarr_required_bits(max_vocab);
    base->word_mask = (1U << base->word_bits) - 1U;
    if (base->word_bits > 25)
        E_ERROR
            ("Sorry, word indices more than %d are not implemented.  Edit util/bit_packing.hh and fix the bit packing functions\n",
             (1U << 25));
    base->total_bits = base->word_bits + remaining_bits;

    base->base = (uint8 *) base_mem;
    base->insert_index = 0;
    base->max_vocab = max_vocab;
}